

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaSetParserErrors
               (xmlSchemaParserCtxtPtr ctxt,xmlSchemaValidityErrorFunc err,
               xmlSchemaValidityWarningFunc warn,void *ctx)

{
  void *ctx_local;
  xmlSchemaValidityWarningFunc warn_local;
  xmlSchemaValidityErrorFunc err_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->errCtxt = ctx;
    if (ctxt->vctxt != (xmlSchemaValidCtxtPtr)0x0) {
      xmlSchemaSetValidErrors(ctxt->vctxt,err,warn,ctx);
    }
  }
  return;
}

Assistant:

void
xmlSchemaSetParserErrors(xmlSchemaParserCtxtPtr ctxt,
                         xmlSchemaValidityErrorFunc err,
                         xmlSchemaValidityWarningFunc warn, void *ctx)
{
    if (ctxt == NULL)
        return;
    ctxt->error = err;
    ctxt->warning = warn;
    ctxt->errCtxt = ctx;
    if (ctxt->vctxt != NULL)
	xmlSchemaSetValidErrors(ctxt->vctxt, err, warn, ctx);
}